

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

QString * __thiscall QProgressBar::text(QProgressBar *this)

{
  int iVar1;
  int iVar2;
  QProgressBarPrivate *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  int progress;
  qint64 totalSteps;
  QProgressBarPrivate *d;
  QString *result;
  QLocale locale;
  QString *this_00;
  QLocale *in_stack_ffffffffffffff18;
  QString *local_d0;
  QString *local_c0;
  QString *local_b0;
  undefined1 local_30 [28];
  undefined4 local_14;
  QLocale local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QProgressBar *)0x6631dc);
  if ((((pQVar3->maximum == 0) && (*(int *)&(pQVar3->super_QWidgetPrivate).field_0x254 == 0)) ||
      (pQVar3->value < *(int *)&(pQVar3->super_QWidgetPrivate).field_0x254)) ||
     ((pQVar3->value == -0x80000000 &&
      (*(int *)&(pQVar3->super_QWidgetPrivate).field_0x254 == -0x80000000)))) {
    QString::QString((QString *)0x663240);
  }
  else {
    iVar1 = pQVar3->maximum;
    iVar2 = *(int *)&(pQVar3->super_QWidgetPrivate).field_0x254;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(this_00,in_RDI);
    local_10 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale(&local_10,&(pQVar3->super_QWidgetPrivate).locale);
    local_14 = QLocale::numberOptions();
    QFlags<QLocale::NumberOption>::operator|
              ((QFlags<QLocale::NumberOption> *)this_00,(NumberOption)((ulong)in_RDI >> 0x20));
    QLocale::setNumberOptions((QFlags_conflict1 *)&local_10);
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_ffffffffffffff18,(size_t)this_00);
    QLocale::toString((longlong)local_30);
    local_b0 = (QString *)QVar4.m_size;
    QString::replace((QLatin1String *)in_RDI,local_b0,(CaseSensitivity)QVar4.m_data);
    QString::~QString((QString *)0x663365);
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_ffffffffffffff18,(size_t)this_00);
    QLocale::toString(in_stack_ffffffffffffff18,(int)((ulong)this_00 >> 0x20));
    local_c0 = (QString *)QVar4.m_size;
    QString::replace((QLatin1String *)in_RDI,local_c0,(CaseSensitivity)QVar4.m_data);
    QString::~QString((QString *)0x6633ce);
    if (iVar1 == iVar2) {
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff18,(size_t)this_00);
      QLocale::toString(in_stack_ffffffffffffff18,(int)((ulong)this_00 >> 0x20));
      local_d0 = (QString *)QVar4.m_size;
      QString::replace((QLatin1String *)in_RDI,local_d0,(CaseSensitivity)QVar4.m_data);
      QString::~QString((QString *)0x663439);
    }
    else {
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff18,(size_t)this_00);
      QLocale::toString((QLocale *)QVar4.m_size,(int)((ulong)this_00 >> 0x20));
      QString::replace((QLatin1String *)in_RDI,(QString *)QVar4.m_size,(CaseSensitivity)QVar4.m_data
                      );
      QString::~QString((QString *)0x6634ec);
    }
    QLocale::~QLocale(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString QProgressBar::text() const
{
    Q_D(const QProgressBar);
    if ((d->maximum == 0 && d->minimum == 0) || d->value < d->minimum
            || (d->value == INT_MIN && d->minimum == INT_MIN))
        return QString();

    qint64 totalSteps = qint64(d->maximum) - d->minimum;

    QString result = d->format;
    QLocale locale = d->locale; // Omit group separators for compatibility with previous versions that were non-localized.
    locale.setNumberOptions(locale.numberOptions() | QLocale::OmitGroupSeparator);
    result.replace("%m"_L1, locale.toString(totalSteps));
    result.replace("%v"_L1, locale.toString(d->value));

    // If max and min are equal and we get this far, it means that the
    // progress bar has one step and that we are on that step. Return
    // 100% here in order to avoid division by zero further down.
    if (totalSteps == 0) {
        result.replace("%p"_L1, locale.toString(100));
        return result;
    }

    const auto progress = static_cast<int>((qint64(d->value) - d->minimum) * 100.0 / totalSteps);
    result.replace("%p"_L1, locale.toString(progress));
    return result;
}